

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O2

quad_value_bit_vector *
bsim::quad_value_bit_vector_operations::lnot
          (quad_value_bit_vector *__return_storage_ptr__,quad_value_bit_vector *a)

{
  byte bVar1;
  long lVar2;
  quad_value local_2a;
  quad_value local_29;
  
  quad_value_bit_vector::quad_value_bit_vector(__return_storage_ptr__,a->N);
  lVar2 = 0;
  do {
    if (a->N <= lVar2) {
      return __return_storage_ptr__;
    }
    local_2a.value =
         (a->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
         super__Vector_impl_data._M_start[lVar2].value;
    if (local_2a.value != 2) {
      if (local_2a.value == 3) {
        __assert_fail("!a.is_high_impedance()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0xf4,"quad_value bsim::operator~(const quad_value &)");
      }
      if (1 < local_2a.value) {
        __assert_fail("a.is_binary()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0xfa,"quad_value bsim::operator~(const quad_value &)");
      }
      bVar1 = quad_value::binary_value(&local_2a);
      quad_value::quad_value(&local_29,~bVar1 & 1);
      local_2a.value = local_29.value;
    }
    (__return_storage_ptr__->bits).
    super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
    super__Vector_impl_data._M_start[lVar2].value = local_2a.value;
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

static inline quad_value_bit_vector lnot(const quad_value_bit_vector& a) {
      quad_value_bit_vector not_a(a.bitLength());
      for (int i = 0; i < a.bitLength(); i++) {
  	not_a.set(i, ~a.get(i));
      }
      return not_a;

    }